

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O2

int file_write(int hdl,void *buffer,long nbytes)

{
  int iVar1;
  size_t sVar2;
  
  if ((handleTable[hdl].last_io_op == 1) &&
     (iVar1 = file_seek(hdl,handleTable[hdl].currentpos), iVar1 != 0)) {
    iVar1 = 0x74;
  }
  else {
    sVar2 = fwrite(buffer,1,nbytes,(FILE *)handleTable[hdl].fileptr);
    if (sVar2 == nbytes) {
      handleTable[hdl].currentpos = handleTable[hdl].currentpos + nbytes;
      handleTable[hdl].last_io_op = 2;
      iVar1 = 0;
    }
    else {
      iVar1 = 0x6a;
    }
  }
  return iVar1;
}

Assistant:

int file_write(int hdl, void *buffer, long nbytes)
/*
  write bytes at the current position in the file
*/
{
    if (handleTable[hdl].last_io_op == IO_READ) 
    {
        if (file_seek(hdl, handleTable[hdl].currentpos))
            return(SEEK_ERROR);
    }

    if((long) fwrite(buffer, 1, nbytes, handleTable[hdl].fileptr) != nbytes)
        return(WRITE_ERROR);

    handleTable[hdl].currentpos += nbytes;
    handleTable[hdl].last_io_op = IO_WRITE;
    return(0);
}